

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::blowUpActiveAggregate
          (TReflectionTraverser *this,TType *baseType,TString *baseName,
          TList<glslang::TIntermBinary_*> *derefs,const_iterator deref,int offset,int blockIndex,
          int arraySize,int topLevelArraySize,int topLevelArrayStride,TStorageQualifier baseStorage,
          bool active)

{
  EShLanguageMask *pEVar1;
  _List_node_base *p_Var2;
  TReflection *pTVar3;
  pointer pTVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  EShReflectionOptions EVar9;
  int iVar10;
  undefined4 extraout_var;
  _List_node_header *deref_00;
  long lVar11;
  TTypeList *pTVar12;
  undefined4 extraout_var_00;
  iterator iVar13;
  long *plVar14;
  TType *pTVar15;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mapped_type *pmVar16;
  uint uVar17;
  int iVar18;
  TList<glslang::TIntermBinary_*> *pTVar19;
  int i;
  uint uVar20;
  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *this_00;
  ulong uVar21;
  mapped_type mVar22;
  int i_1;
  bool bVar23;
  TStorageQualifier TVar24;
  uint local_278;
  int local_274;
  TType *local_270;
  pool_allocator<char> local_230;
  int local_224;
  long local_220;
  ulong local_218;
  TVector<int> memberOffsets;
  TString name;
  TString newBaseName_2;
  TString local_188;
  TString newBaseName;
  TArraySizes *local_100;
  TString newBaseName_1;
  
  EVar9 = this->reflection->options;
  pTVar19 = derefs;
  iVar6 = (*baseType->_vptr_TType[7])(baseType);
  bVar23 = false;
  if (iVar6 == 0x10) {
    iVar6 = (*baseType->_vptr_TType[0xb])(baseType);
    bVar23 = (*(uint *)(CONCAT44(extraout_var,iVar6) + 8) & 0x7f) == 6;
  }
  local_218 = (ulong)(uint)topLevelArraySize;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&name,baseName);
  deref_00 = &(derefs->
              super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ).
              super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ._M_impl._M_node;
  local_274 = offset;
  local_270 = baseType;
  do {
    if ((_List_node_header *)deref._M_node == deref_00) {
      bVar5 = isReflectionGranularity(this,local_270);
      if (bVar5) {
        if (((this->reflection->options & EShReflectionBasicArraySuffix) != EShReflectionDefault) &&
           (iVar6 = (*local_270->_vptr_TType[0x1d])(), (char)iVar6 != '\0')) {
          newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &newBaseName,"[0]",(pool_allocator<char> *)&newBaseName_1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&name,&newBaseName);
        }
        if (arraySize == 0) {
          arraySize = mapToGlArraySize(this,local_270);
        }
        pTVar3 = this->reflection;
        lVar11 = 0x128;
        if ((pTVar3->options & EShReflectionSeparateBuffers) == EShReflectionDefault) {
          lVar11 = 0xf8;
        }
        if (baseStorage != EvqBuffer) {
          lVar11 = 0xf8;
        }
        this_00 = (vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *
                  )((long)&pTVar3->_vptr_TReflection + lVar11);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1);
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&(pTVar3->nameToIndex)._M_t,(key_type *)&newBaseName);
        std::__cxx11::string::_M_dispose();
        pTVar3 = this->reflection;
        if ((_Rb_tree_header *)iVar13._M_node ==
            &(pTVar3->nameToIndex)._M_t._M_impl.super__Rb_tree_header) {
          mVar22 = (mapped_type)
                   (((long)(this_00->
                           super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x50);
          newBaseName_2._M_dataplus.super_allocator_type.allocator._0_4_ = mVar22;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1)
          ;
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&pTVar3->nameToIndex,(key_type *)&newBaseName);
          *pmVar16 = mVar22;
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&newBaseName_1,name._M_dataplus._M_p,
                     (allocator<char> *)&memberOffsets);
          iVar6 = mapToGlType(this,local_270);
          TObjectReflection::TObjectReflection
                    ((TObjectReflection *)&newBaseName,(string *)&newBaseName_1,local_270,local_274,
                     iVar6,arraySize,blockIndex);
          std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
          emplace_back<glslang::TObjectReflection>(this_00,(TObjectReflection *)&newBaseName);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          iVar6 = (*local_270->_vptr_TType[0x1d])(local_270);
          if ((char)iVar6 != '\0') {
            iVar6 = getArrayStride(this,baseType,local_270);
            (this_00->
            super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
            )._M_impl.super__Vector_impl_data._M_finish[-1].arrayStride = iVar6;
            if (topLevelArrayStride == 0) {
              topLevelArrayStride = iVar6;
            }
          }
          EVar9 = this->reflection->options;
          if (((EVar9 & EShReflectionSeparateBuffers) != EShReflectionDefault) &&
             (local_270->field_0x8 == '\r')) {
            std::vector<int,_std::allocator<int>_>::push_back
                      (&this->reflection->atomicCounterUniformIndices,
                       (value_type_conflict5 *)&newBaseName_2);
            EVar9 = this->reflection->options;
          }
          pTVar4 = (this_00->
                   super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pTVar4[-1].topLevelArraySize = topLevelArraySize;
          pTVar4[-1].topLevelArrayStride = topLevelArrayStride;
          if (active && (EVar9 & EShReflectionAllBlockVariables) != EShReflectionDefault) {
            pTVar4[-1].stages = pTVar4[-1].stages | 1 << ((char)this->intermediate->language & 0x1f)
            ;
          }
        }
        else {
          if (1 < arraySize) {
            pTVar4 = (this_00->
                     super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar6 = pTVar4[(int)iVar13._M_node[2]._M_color].size;
            if (iVar6 < arraySize) {
              iVar6 = arraySize;
            }
            pTVar4[(int)iVar13._M_node[2]._M_color].size = iVar6;
          }
          if (active && (pTVar3->options & EShReflectionAllBlockVariables) != EShReflectionDefault)
          {
            pEVar1 = &(this_00->
                      super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                      )._M_impl.super__Vector_impl_data._M_start[(int)iVar13._M_node[2]._M_color].
                      stages;
            *pEVar1 = *pEVar1 | 1 << ((char)this->intermediate->language & 0x1f);
          }
        }
      }
      else {
        iVar6 = (*local_270->_vptr_TType[0x1d])();
        if ((char)iVar6 == '\0') {
          pTVar12 = TType::getStruct(local_270);
          TVector<int>::TVector(&memberOffsets);
          if (-1 < local_274) {
            std::vector<int,_glslang::pool_allocator<int>_>::resize
                      (&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>,
                       (long)(pTVar12->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar12->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            getOffsets(this,local_270,
                       (TVector<int> *)
                       &memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>);
          }
          local_220 = 0;
          local_278 = local_274;
          for (lVar11 = 0;
              lVar11 < (int)((ulong)((long)(pTVar12->
                                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ).
                                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pTVar12->
                                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          ).
                                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
              lVar11 = lVar11 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string(&newBaseName_2,&name);
            if (newBaseName_2._M_string_length != 0) {
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (&newBaseName_2,".");
            }
            __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(**(long **)((long)&((pTVar12->
                                                                                                          
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                            local_220) + 0x30))();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&newBaseName_2,__str);
            TType::TType((TType *)&newBaseName,local_270,(int)lVar11,false);
            if (-1 < (int)local_278) {
              local_278 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11] + local_274;
            }
            iVar8 = (*local_270->_vptr_TType[7])();
            iVar6 = topLevelArrayStride;
            if (((iVar8 == 0x10) &&
                (iVar8 = (*local_270->_vptr_TType[0xb])(),
                (*(uint *)(CONCAT44(extraout_var_01,iVar8) + 8) & 0x7f) == 6)) &&
               (local_100 != (TArraySizes *)0x0)) {
              iVar6 = getArrayStride(this,baseType,(TType *)&newBaseName);
            }
            uVar21 = local_218 & 0xffffffff;
            if ((int)local_218 == -1 && iVar6 == 0) {
              uVar21 = (ulong)(bVar23 - 1 | 1);
            }
            pTVar15 = (TType *)&newBaseName;
            uVar20 = local_278;
            local_218 = uVar21;
            TVar24 = baseStorage;
            bVar5 = active;
            if (((byte)EVar9 & bVar23) != 0) {
              if (local_100 == (TArraySizes *)0x0) {
                uVar20 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                         super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
                iVar8 = (*local_270->_vptr_TType[0xb])();
                iVar6 = 0;
                uVar21 = 1;
                TVar24 = *(TStorageQualifier *)(CONCAT44(extraout_var_03,iVar8) + 8) & 0x7f;
                bVar5 = false;
              }
              else {
                if ((byte)newBaseName._M_dataplus._M_p - 0xf < 2) {
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                            (&newBaseName_2,"[0]");
                  bVar5 = TType::isUnsizedArray((TType *)&newBaseName);
                  uVar21 = 0;
                  if (!bVar5) {
                    uVar20 = TSmallArrayVector::getDimSize(&local_100->sizes,0);
                    uVar21 = (ulong)uVar20;
                  }
                  TType::TType((TType *)&newBaseName_1,(TType *)&newBaseName,0,false);
                  local_224 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                              super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar11];
                  iVar8 = (*local_270->_vptr_TType[0xb])();
                  TVar24 = *(TStorageQualifier *)(CONCAT44(extraout_var_02,iVar8) + 8);
                  pTVar15 = (TType *)&newBaseName_1;
                  uVar20 = local_224;
                }
                else {
                  bVar5 = TType::isUnsizedArray((TType *)&newBaseName);
                  uVar21 = 0;
                  if (!bVar5) {
                    uVar20 = TSmallArrayVector::getDimSize(&local_100->sizes,0);
                    uVar21 = (ulong)uVar20;
                  }
                  uVar20 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                           super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11];
                  iVar6 = (*local_270->_vptr_TType[0xb])();
                  TVar24 = *(TStorageQualifier *)(CONCAT44(extraout_var_04,iVar6) + 8);
                  iVar6 = 0;
                }
                TVar24 = TVar24 & 0x7f;
                bVar5 = false;
              }
            }
            blowUpActiveAggregate
                      (this,pTVar15,&newBaseName_2,derefs,(const_iterator)deref_00,uVar20,blockIndex
                       ,0,(int)uVar21,iVar6,TVar24,bVar5);
            local_220 = local_220 + 0x20;
          }
        }
        else {
          if (local_274 < 0) {
            iVar6 = 0;
          }
          else {
            iVar6 = getArrayStride(this,baseType,local_270);
          }
          local_278 = (*local_270->_vptr_TType[0xf])();
          if ((int)local_278 < 2) {
            local_278 = 1;
          }
          if ((((EVar9 & EShReflectionStrictArraySuffix) != EShReflectionDefault) && (bVar23)) ||
             ((pTVar19 = (TList<glslang::TIntermBinary_*> *)(ulong)(uint)topLevelArraySize,
              local_278 == topLevelArraySize && (topLevelArrayStride == 0)))) {
            local_278 = 1;
          }
          if (topLevelArrayStride == 0) {
            topLevelArrayStride = iVar6;
          }
          iVar8 = local_274;
          for (uVar20 = 0; iVar18 = (int)pTVar19, local_278 != uVar20; uVar20 = uVar20 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::basic_string(&newBaseName_1,&name);
            iVar10 = (*local_270->_vptr_TType[7])();
            if (iVar10 != 0x10) {
              local_230.allocator = GetThreadPoolAllocator();
              std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
              ::basic_string<glslang::std::allocator<char>>
                        ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                         &memberOffsets,"[",&local_230);
              String_abi_cxx11_(&local_188,(glslang *)(ulong)uVar20,10,iVar18);
              std::operator+(&newBaseName_2,
                             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&memberOffsets,&local_188);
              std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)&newBaseName,&newBaseName_2,"]");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (&newBaseName_1,
                         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&newBaseName);
            }
            TType::TType((TType *)&newBaseName,local_270,0,false);
            if (-1 < iVar8) {
              iVar8 = local_274;
            }
            pTVar19 = derefs;
            blowUpActiveAggregate
                      (this,(TType *)&newBaseName,&newBaseName_1,derefs,(const_iterator)deref_00,
                       iVar8,blockIndex,0,topLevelArraySize,topLevelArrayStride,baseStorage,active);
            local_274 = local_274 + iVar6;
          }
        }
      }
      return;
    }
    p_Var2 = deref._M_node[1]._M_next;
    local_270 = (TType *)(*(code *)p_Var2->_M_next[0xf]._M_next)(p_Var2);
    iVar6 = *(int *)&p_Var2[0xb]._M_prev;
    if (iVar6 == 0x33) {
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
      pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
      iVar6 = getArrayStride(this,baseType,pTVar15);
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_prev)(p_Var2);
      pTVar19 = (TList<glslang::TIntermBinary_*> *)*plVar14;
      lVar11 = (*(code *)pTVar19[1].
                         super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                         .
                         super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                         ._M_impl._M_node.super__List_node_base._M_next)(plVar14);
      uVar20 = **(uint **)(*(long *)(lVar11 + 0xc0) + 8);
      iVar8 = (*local_270->_vptr_TType[7])();
      if (iVar8 != 0x10) {
        if ((EVar9 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
          iVar8 = (*baseType->_vptr_TType[7])();
          if (iVar8 != 0x10) goto LAB_0037fc9d;
        }
        else if (bVar23) {
          newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &newBaseName,"[0]",(pool_allocator<char> *)&newBaseName_1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&name,&newBaseName);
        }
        else {
LAB_0037fc9d:
          local_188._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &newBaseName_2,"[",(pool_allocator<char> *)&local_188);
          String_abi_cxx11_((TString *)&memberOffsets,(glslang *)(ulong)uVar20,10,(int)pTVar19);
          std::operator+(&newBaseName_1,&newBaseName_2,
                         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&memberOffsets);
          std::operator+(&newBaseName,&newBaseName_1,"]");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&name,&newBaseName);
          if (-1 < local_274) {
            local_274 = local_274 + uVar20 * iVar6;
          }
        }
      }
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = iVar6;
      }
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = 0;
      }
      else {
        plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
        pTVar19 = (TList<glslang::TIntermBinary_*> *)*plVar14;
        pTVar15 = (TType *)(*(code *)pTVar19[7].
                                     super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                     .
                                     super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev)(plVar14);
LAB_0037fd5b:
        iVar6 = (*pTVar15->_vptr_TType[0x1d])();
        if ((char)iVar6 != '\0') {
          bVar23 = false;
        }
      }
    }
    else if (iVar6 == 0x35) {
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_prev)(p_Var2);
      lVar11 = (**(code **)(*plVar14 + 0x28))(plVar14);
      iVar6 = **(int **)(*(long *)(lVar11 + 0xc0) + 8);
      if (-1 < local_274) {
        plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
        pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        iVar8 = TIntermediate::getOffset(pTVar15,iVar6);
        local_274 = local_274 + iVar8;
      }
      if (name._M_string_length != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&name,".");
      }
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
      pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
      pTVar12 = TType::getStruct(pTVar15);
      iVar6 = (*((pTVar12->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar6].type)->_vptr_TType[6])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&name,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar6));
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
      plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
      pTVar19 = (TList<glslang::TIntermBinary_*> *)*plVar14;
      iVar6 = (*(code *)pTVar19[1].
                        super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        .
                        super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                        ._M_impl._M_node._M_size)(plVar14);
      pTVar15 = local_270;
      if (iVar6 != 0x10) goto LAB_0037fd5b;
    }
    else if (iVar6 == 0x34) {
      plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
      pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
      iVar6 = getArrayStride(this,baseType,pTVar15);
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = iVar6;
      }
      uVar20 = 0;
      break;
    }
    deref._M_node = (deref._M_node)->_M_next;
  } while( true );
LAB_0037ff80:
  plVar14 = (long *)(*(code *)p_Var2->_M_next[0x19]._M_next)(p_Var2);
  plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
  uVar7 = (**(code **)(*plVar14 + 0x78))(plVar14);
  uVar17 = 1;
  if ((int)uVar7 < 2) {
    uVar7 = uVar17;
  }
  if (uVar7 <= uVar20) {
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&newBaseName,&name);
  iVar8 = (*local_270->_vptr_TType[7])();
  if (iVar8 != 0x10) {
    if ((EVar9 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
      iVar8 = (*baseType->_vptr_TType[7])(baseType);
      if (iVar8 != 0x10) goto LAB_00380020;
    }
    else {
      if (bVar23 == false) {
LAB_00380020:
        local_230.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &memberOffsets,"[",&local_230);
        String_abi_cxx11_(&local_188,(glslang *)(ulong)uVar20,10,uVar17);
        std::operator+(&newBaseName_2,
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )&memberOffsets,&local_188);
        std::operator+(&newBaseName_1,&newBaseName_2,"]");
      }
      else {
        newBaseName_2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &newBaseName_1,"[0]",(pool_allocator<char> *)&newBaseName_2);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&newBaseName,&newBaseName_1);
    }
  }
  blowUpActiveAggregate
            (this,local_270,&newBaseName,derefs,(deref._M_node)->_M_next,local_274,blockIndex,
             arraySize,topLevelArraySize,topLevelArrayStride,baseStorage,active);
  iVar8 = iVar6;
  if (local_274 < 0) {
    iVar8 = 0;
  }
  local_274 = local_274 + iVar8;
  uVar20 = uVar20 + 1;
  goto LAB_0037ff80;
}

Assistant:

void blowUpActiveAggregate(const TType& baseType, const TString& baseName, const TList<TIntermBinary*>& derefs,
                               TList<TIntermBinary*>::const_iterator deref, int offset, int blockIndex, int arraySize,
                               int topLevelArraySize, int topLevelArrayStride, TStorageQualifier baseStorage, bool active)
    {
        // when strictArraySuffix is enabled, we closely follow the rules from ARB_program_interface_query.
        // Broadly:
        // * arrays-of-structs always have a [x] suffix.
        // * with array-of-struct variables in the root of a buffer block, only ever return [0].
        // * otherwise, array suffixes are added whenever we iterate, even if that means expanding out an array.
        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        // is this variable inside a buffer block. This flag is set back to false after we iterate inside the first array element.
        bool blockParent = (baseType.getBasicType() == EbtBlock && baseType.getQualifier().storage == EvqBuffer);

        // process the part of the dereference chain that was explicit in the shader
        TString name = baseName;
        const TType* terminalType = &baseType;
        for (; deref != derefs.end(); ++deref) {
            TIntermBinary* visitNode = *deref;
            terminalType = &visitNode->getType();
            int index;
            switch (visitNode->getOp()) {
            case EOpIndexIndirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // Visit all the indices of this array, and for each one add on the remaining dereferencing
                for (int i = 0; i < std::max(visitNode->getLeft()->getType().getOuterArraySize(), 1); ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() == EbtBlock) {}
                    else if (strictArraySuffix && blockParent)
                        newBaseName.append(TString("[0]"));
                    else if (strictArraySuffix || baseType.getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TList<TIntermBinary*>::const_iterator nextDeref = deref;
                    ++nextDeref;
                    blowUpActiveAggregate(*terminalType, newBaseName, derefs, nextDeref, offset, blockIndex, arraySize,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);

                    if (offset >= 0)
                        offset += stride;
                }

                // it was all completed in the recursive calls above
                return;
            }
            case EOpIndexDirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (terminalType->getBasicType() == EbtBlock) {}
                else if (strictArraySuffix && blockParent)
                    name.append(TString("[0]"));
                else if (strictArraySuffix || baseType.getBasicType() != EbtBlock) {
                    name.append(TString("[") + String(index) + "]");

                    if (offset >= 0)
                        offset += stride * index;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // expand top-level arrays in blocks with [0] suffix
                if (topLevelArrayStride != 0 && visitNode->getLeft()->getType().isArray()) {
                    blockParent = false;
                }
                break;
            }
            case EOpIndexDirectStruct:
                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (offset >= 0)
                    offset += intermediate.getOffset(visitNode->getLeft()->getType(), index);
                if (name.size() > 0)
                    name.append(".");
                name.append((*visitNode->getLeft()->getType().getStruct())[index].type->getFieldName());

                // expand non top-level arrays with [x] suffix
                if (visitNode->getLeft()->getType().getBasicType() != EbtBlock && terminalType->isArray())
                {
                    blockParent = false;
                }
                break;
            default:
                break;
            }
        }

        // if the terminalType is still too coarse a granularity, this is still an aggregate to expand, expand it...
        if (! isReflectionGranularity(*terminalType)) {
            // the base offset of this node, that children are relative to
            int baseOffset = offset;

            if (terminalType->isArray()) {
                // Visit all the indices of this array, and for each one,
                // fully explode the remaining aggregate to dereference

                int stride = 0;
                if (offset >= 0)
                    stride = getArrayStride(baseType, *terminalType);

                int arrayIterateSize = std::max(terminalType->getOuterArraySize(), 1);

                // for top-level arrays in blocks, only expand [0] to avoid explosion of items
                if ((strictArraySuffix && blockParent) ||
                    ((topLevelArraySize == arrayIterateSize) && (topLevelArrayStride == 0))) {
                    arrayIterateSize = 1;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                for (int i = 0; i < arrayIterateSize; ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TType derefType(*terminalType, 0);
                    if (offset >= 0)
                        offset = baseOffset + stride * i;

                    blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);
                }
            } else {
                // Visit all members of this aggregate, and for each one,
                // fully explode the remaining aggregate to dereference
                const TTypeList& typeList = *terminalType->getStruct();

                TVector<int> memberOffsets;

                if (baseOffset >= 0) {
                    memberOffsets.resize(typeList.size());
                    getOffsets(*terminalType, memberOffsets);
                }

                for (int i = 0; i < (int)typeList.size(); ++i) {
                    TString newBaseName = name;
                    if (newBaseName.size() > 0)
                        newBaseName.append(".");
                    newBaseName.append(typeList[i].type->getFieldName());
                    TType derefType(*terminalType, i);
                    if (offset >= 0)
                        offset = baseOffset + memberOffsets[i];

                    int arrayStride = topLevelArrayStride;
                    if (terminalType->getBasicType() == EbtBlock && terminalType->getQualifier().storage == EvqBuffer &&
                        derefType.isArray()) {
                        arrayStride = getArrayStride(baseType, derefType);
                    }

                    if (topLevelArraySize == -1 && arrayStride == 0 && blockParent)
                        topLevelArraySize = 1;

                    if (strictArraySuffix && blockParent) {
                        // if this member is an array, store the top-level array stride but start the explosion from
                        // the inner struct type.
                        if (derefType.isArray() && derefType.isStruct()) {
                            newBaseName.append("[0]");
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(TType(derefType, 0), newBaseName, derefs, derefs.end(), memberOffsets[i],
                                blockIndex, 0, dimSize, arrayStride, terminalType->getQualifier().storage, false);
                        }
                        else if (derefType.isArray()) {
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, dimSize, 0, terminalType->getQualifier().storage, false);
                        }
                        else {
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, 1, 0, terminalType->getQualifier().storage, false);
                        }
                    } else {
                        blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                              topLevelArraySize, arrayStride, baseStorage, active);
                    }
                }
            }

            // it was all completed in the recursive calls above
            return;
        }

        if ((reflection.options & EShReflectionBasicArraySuffix) && terminalType->isArray()) {
            name.append(TString("[0]"));
        }

        // Finally, add a full string to the reflection database, and update the array size if necessary.
        // If the dereferenced entity to record is an array, compute the size and update the maximum size.

        // there might not be a final array dereference, it could have been copied as an array object
        if (arraySize == 0)
            arraySize = mapToGlArraySize(*terminalType);

        TReflection::TMapIndexToReflection& variables = reflection.GetVariableMapForStorage(baseStorage);

        TReflection::TNameToIndex::const_iterator it = reflection.nameToIndex.find(name.c_str());
        if (it == reflection.nameToIndex.end()) {
            int uniformIndex = (int)variables.size();
            reflection.nameToIndex[name.c_str()] = uniformIndex;
            variables.push_back(TObjectReflection(name.c_str(), *terminalType, offset, mapToGlType(*terminalType),
                                                  arraySize, blockIndex));
            if (terminalType->isArray()) {
                variables.back().arrayStride = getArrayStride(baseType, *terminalType);
                if (topLevelArrayStride == 0)
                    topLevelArrayStride = variables.back().arrayStride;
            }

            if ((reflection.options & EShReflectionSeparateBuffers) && terminalType->isAtomic())
                reflection.atomicCounterUniformIndices.push_back(uniformIndex);

            variables.back().topLevelArraySize = topLevelArraySize;
            variables.back().topLevelArrayStride = topLevelArrayStride;
            
            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
                EShLanguageMask& stages = variables.back().stages;
                stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        } else {
            if (arraySize > 1) {
                int& reflectedArraySize = variables[it->second].size;
                reflectedArraySize = std::max(arraySize, reflectedArraySize);
            }

            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
              EShLanguageMask& stages = variables[it->second].stages;
              stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        }
    }